

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Node __thiscall trieste::NodeDef::scope(NodeDef *this)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  Node NVar4;
  NodeDef *local_20;
  NodeDef *p;
  NodeDef *this_local;
  shared_ptr<trieste::NodeDef> *node;
  
  local_20 = *(NodeDef **)(in_RSI + 0x48);
  while (local_20 != (NodeDef *)0x0) {
    CLI::std::enable_shared_from_this<trieste::NodeDef>::shared_from_this
              (&this->super_enable_shared_from_this<trieste::NodeDef>);
    peVar2 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->symtab_);
    _Var3._M_pi = extraout_RDX;
    if (bVar1) goto LAB_001a30f4;
    peVar2 = CLI::std::
             __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    local_20 = peVar2->parent_;
    CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)this);
  }
  CLI::std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this);
  _Var3._M_pi = extraout_RDX_00;
LAB_001a30f4:
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Node)NVar4.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node scope()
    {
      auto p = parent_;

      while (p)
      {
        auto node = p->shared_from_this();

        if (node->symtab_)
          return node;

        p = node->parent_;
      }

      return {};
    }